

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_set_update4_info(Integer g_a)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  C_Integer *pCVar9;
  global_array_t *pgVar10;
  int _d;
  Integer proc;
  logical lVar11;
  double *pdVar12;
  Integer *map;
  double *proclist;
  double dVar13;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  int *piVar17;
  undefined8 *puVar18;
  int *piVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  C_Integer CVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long ndim;
  int _ndim;
  ulong uVar30;
  double *pdVar31;
  int _index [7];
  Integer _hi [7];
  Integer np;
  long local_4f0;
  Integer shi_rcv [7];
  Integer slo_rcv [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer width [7];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer phi_snd [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer dims [7];
  Integer increment [7];
  Integer index [7];
  
  proc = pnga_nodeid();
  lVar11 = pnga_has_ghosts(g_a);
  if (lVar11 == 0) {
    return 1;
  }
  lVar11 = gai_check_ghost_distr(g_a);
  pgVar10 = GA;
  if (lVar11 == 0) {
    return 0;
  }
  lVar1 = g_a + 1000;
  iVar6 = GA[lVar1].elemsize;
  sVar4 = GA[lVar1].ndim;
  iVar27 = (int)sVar4;
  iVar7 = GA[lVar1].p_handle;
  iVar20 = iVar27 * 0xc + 0x28;
  iVar24 = iVar27 * 0xc + 0x2f;
  if (-1 < iVar20) {
    iVar24 = iVar20;
  }
  pdVar12 = (double *)malloc((long)(((iVar24 >> 3) + 1) * iVar27 * 2 + 1) << 3);
  pgVar10[lVar1].cache = pdVar12;
  pdVar12 = GA[lVar1].cache;
  pnga_distribution(g_a,proc,lo_loc,hi_loc);
  IVar16 = GAnproc;
  ndim = (long)iVar27;
  if (0 < sVar4) {
    lVar21 = 0;
    do {
      increment[lVar21] = 0;
      width[lVar21] = GA[g_a + 1000].width[lVar21];
      dims[lVar21] = GA[g_a + 1000].dims[lVar21];
      if ((lo_loc[lVar21] == 0) && (hi_loc[lVar21] == -1)) {
        *pdVar12 = 0.0;
        return 0;
      }
      lVar21 = lVar21 + 1;
    } while (ndim != lVar21);
  }
  map = (Integer *)malloc(GAnproc * 0x70 | 8);
  if (map == (Integer *)0x0) {
    pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
    IVar16 = GAnproc;
  }
  proclist = (double *)malloc(IVar16 << 3);
  if (proclist == (double *)0x0) {
    pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);
  }
  dVar13 = (double)(long)iVar6;
  pnga_proc_topology(g_a,proc,index);
  if (0 < sVar4) {
    lVar22 = 1;
    lVar21 = 0;
    do {
      lVar22 = lVar22 * ((hi_loc[lVar21] - lo_loc[lVar21]) + width[lVar21] * 2 + 1);
      lVar21 = lVar21 + 1;
    } while (ndim != lVar21);
    if (0 < sVar4) {
      lVar28 = 0;
      lVar21 = 1;
      do {
        lVar14 = (lVar22 / ((hi_loc[lVar28] - lo_loc[lVar28]) + width[lVar28] * 2 + 1)) *
                 width[lVar28];
        if (lVar14 < lVar21) {
          lVar14 = lVar21;
        }
        lVar28 = lVar28 + 1;
        lVar21 = lVar14;
      } while (ndim != lVar28);
      *pdVar12 = (double)(lVar14 * (long)dVar13);
      if (0 < sVar4) {
        lVar22 = (long)(int)proc;
        lVar21 = 2;
        if (2 < ndim) {
          lVar21 = ndim;
        }
        local_4f0 = lVar21 + -1;
        lVar21 = 0;
        pdVar12 = pdVar12 + 1;
        do {
          pdVar31 = pdVar12;
          if (width[lVar21] != 0) {
            get_remote_block_neg(lVar21,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
            lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
            if (lVar11 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
              sVar15 = strlen(err_string);
              iVar24 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar28 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rcv[lVar28],shi_rcv[lVar28]);
                  sVar15 = strlen(err_string);
                  iVar24 = (int)sVar15;
                  lVar28 = lVar28 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar28 < IVar16);
              }
              (err_string + iVar24)[0] = ']';
              (err_string + iVar24)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            dVar8 = *proclist;
            pdVar12[2] = dVar8;
            if (-1 < iVar7) {
              pdVar12[2] = (double)(long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
            }
            pdVar31 = pdVar12 + 4;
            piVar17 = (int *)((long)pdVar12 + ndim * 4 + 0x20);
            plVar2 = (long *)(piVar17 + ndim);
            puVar18 = (undefined8 *)((long)plVar2 + ndim * 4 + 8);
            lVar28 = 0;
            do {
              if (lVar21 == lVar28) {
                lVar14 = hi_loc[lVar21] + 1;
                lVar23 = hi_loc[lVar21] + width[lVar21];
              }
              else {
                lVar14 = lo_loc[lVar28];
                lVar23 = hi_loc[lVar28];
              }
              lo_rcv[lVar28] = lVar14;
              hi_rcv[lVar28] = lVar23;
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            lVar28 = 0;
            do {
              if (lVar21 == lVar28) {
                lVar14 = hi_rcv[lVar21];
                if (dims[lVar21] < lVar14) {
                  slo_rcv[lVar21] = 1;
                  lVar14 = width[lVar21];
                }
                else {
                  slo_rcv[lVar21] = lo_rcv[lVar21];
                }
                shi_rcv[lVar21] = lVar14;
              }
              else {
                slo_rcv[lVar28] = lo_rcv[lVar28];
                shi_rcv[lVar28] = hi_rcv[lVar28];
              }
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
            if (lVar11 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
              sVar15 = strlen(err_string);
              iVar24 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar28 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rcv[lVar28],shi_rcv[lVar28]);
                  sVar15 = strlen(err_string);
                  iVar24 = (int)sVar15;
                  lVar28 = lVar28 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar28 < IVar16);
              }
              (err_string + iVar24)[0] = ']';
              (err_string + iVar24)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            dVar8 = *proclist;
            pdVar12[3] = dVar8;
            if (-1 < iVar7) {
              pdVar12[3] = (double)(long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
            }
            pgVar10 = GA;
            lVar28 = 0;
            do {
              if (increment[lVar28] == 0) {
                if (lVar21 == lVar28) {
                  lVar14 = width[lVar21];
                  plo_snd[lVar21] = lVar14;
                  phi_snd[lVar21] = lVar14 * 2 + -1;
                  plo_rcv[lVar21] = lVar14 + (hi_loc[lVar21] - lo_loc[lVar21]) + 1;
                  phi_rcv[lVar21] = (hi_loc[lVar21] - lo_loc[lVar21]) + lVar14 * 2;
                }
                else {
                  lVar14 = width[lVar28];
                  plo_snd[lVar28] = lVar14;
                  lVar23 = (hi_loc[lVar28] - lo_loc[lVar28]) + lVar14;
                  phi_snd[lVar28] = lVar23;
                  plo_rcv[lVar28] = lVar14;
                  phi_rcv[lVar28] = lVar23;
                }
              }
              else {
                plo_rcv[lVar28] = 0;
                lVar14 = (hi_loc[lVar28] - lo_loc[lVar28]) + increment[lVar28];
                phi_rcv[lVar28] = lVar14;
                plo_snd[lVar28] = 0;
                phi_snd[lVar28] = lVar14;
              }
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            uVar5 = GA[lVar1].ndim;
            uVar30 = (ulong)(short)uVar5;
            iVar24 = GA[lVar1].distr_type;
            if (iVar24 - 1U < 3) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                lVar28 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar28);
                  lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + lVar28 * 2);
                  *(long *)(err_string + lVar28 * 2) = lVar14 * iVar24 + 1;
                  lVar14 = ((long)iVar24 + 1) * lVar14;
                  lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar28 * 2);
                  if (lVar23 <= lVar14) {
                    lVar14 = lVar23;
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 4) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar1].mapc;
                lVar28 = 0;
                iVar24 = 0;
                do {
                  iVar20 = *(int *)((long)_index + lVar28);
                  lVar23 = (long)iVar24 + (long)iVar20;
                  *(C_Integer *)(err_string + lVar28 * 2) = pCVar9[lVar23];
                  lVar14 = *(long *)((long)GA[lVar1].num_blocks + lVar28 * 2);
                  if ((long)iVar20 < lVar14 + -1) {
                    lVar23 = pCVar9[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar28 * 2);
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar23;
                  iVar24 = iVar24 + (int)lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) {
LAB_0017df6f:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar30 * 8;
                      goto LAB_0017df7d;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar28 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) goto LAB_0017df6f;
                  if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar28 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar5) {
                sVar15 = (ulong)uVar5 << 3;
LAB_0017df7d:
                memset(err_string,0,sVar15);
                memset(_hi,0xff,sVar15);
              }
            }
            if (uVar30 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar28 = 1;
              lVar14 = 0;
            }
            else {
              lVar28 = 1;
              lVar23 = 0;
              lVar14 = 0;
              do {
                lVar14 = lVar14 + plo_snd[lVar23] * lVar28;
                lVar29 = (_hi[lVar23] - hi_loc[lVar23 + -0x20]) +
                         pgVar10[g_a + 1000].width[lVar23] * 2 + 1;
                ld_loc[lVar23] = lVar29;
                lVar28 = lVar28 * lVar29;
                lVar23 = lVar23 + 1;
              } while (uVar30 - 1 != lVar23);
            }
            *pdVar12 = (double)(pgVar10[lVar1].ptr[proc] +
                               (long)pgVar10[lVar1].elemsize *
                               (lVar28 * plo_snd[uVar30 - 1] + lVar14));
            pgVar10 = GA;
            uVar5 = GA[lVar1].ndim;
            uVar30 = (ulong)(short)uVar5;
            iVar24 = GA[lVar1].distr_type;
            if (iVar24 - 1U < 3) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                lVar28 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar28);
                  lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + lVar28 * 2);
                  *(long *)(err_string + lVar28 * 2) = lVar14 * iVar24 + 1;
                  lVar14 = ((long)iVar24 + 1) * lVar14;
                  lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar28 * 2);
                  if (lVar23 <= lVar14) {
                    lVar14 = lVar23;
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 4) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar1].mapc;
                lVar28 = 0;
                iVar24 = 0;
                do {
                  iVar20 = *(int *)((long)_index + lVar28);
                  lVar23 = (long)iVar24 + (long)iVar20;
                  *(C_Integer *)(err_string + lVar28 * 2) = pCVar9[lVar23];
                  lVar14 = *(long *)((long)GA[lVar1].num_blocks + lVar28 * 2);
                  if ((long)iVar20 < lVar14 + -1) {
                    lVar23 = pCVar9[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar28 * 2);
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar23;
                  iVar24 = iVar24 + (int)lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) {
LAB_0017e3cf:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar30 * 8;
                      goto LAB_0017e3dd;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) goto LAB_0017e3cf;
                  if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar5) {
                sVar15 = (ulong)uVar5 << 3;
LAB_0017e3dd:
                memset(err_string,0,sVar15);
                memset(_hi,0xff,sVar15);
              }
            }
            if (uVar30 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar28 = 1;
              lVar14 = 0;
            }
            else {
              lVar28 = 1;
              lVar14 = 0;
              lVar23 = 0;
              do {
                lVar14 = lVar14 + plo_rcv[lVar23] * lVar28;
                lVar29 = (_hi[lVar23] - hi_loc[lVar23 + -0x20]) +
                         pgVar10[g_a + 1000].width[lVar23] * 2 + 1;
                ld_loc[lVar23] = lVar29;
                lVar28 = lVar28 * lVar29;
                lVar23 = lVar23 + 1;
              } while (uVar30 - 1 != lVar23);
            }
            pdVar12[1] = (double)(pgVar10[lVar1].ptr[proc] +
                                 (long)pgVar10[lVar1].elemsize *
                                 (lVar28 * plo_rcv[uVar30 - 1] + lVar14));
            *(int *)(pdVar12 + 4) = iVar6;
            *piVar17 = iVar6;
            if (sVar4 != 1) {
              lVar28 = 0;
              iVar24 = iVar6;
              iVar20 = iVar6;
              do {
                IVar16 = ld_loc[lVar28];
                iVar20 = iVar20 * (int)IVar16;
                *(int *)((long)pdVar31 + ndim * 4) = iVar20;
                *(int *)pdVar31 = iVar24 * (int)IVar16;
                lVar28 = lVar28 + 1;
                *(int *)((long)pdVar31 + ndim * 4 + 4) = iVar20;
                iVar24 = *(int *)pdVar31;
                *(int *)((long)pdVar31 + 4) = iVar24;
                pdVar31 = (double *)((long)pdVar31 + 4);
              } while (local_4f0 != lVar28);
            }
            lVar28 = 0;
            do {
              *(int *)((long)plVar2 + lVar28 * 4 + 8) =
                   ((int)phi_rcv[lVar28] - (int)plo_rcv[lVar28]) + 1;
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            *plVar2 = 1;
            lVar28 = 1;
            lVar14 = 0;
            do {
              lVar28 = lVar28 * ((phi_snd[lVar14] - plo_snd[lVar14]) + 1);
              *plVar2 = lVar28;
              lVar14 = lVar14 + 1;
            } while (ndim != lVar14);
            *plVar2 = lVar28 * (long)dVar13;
            *(int *)(plVar2 + 1) = (int)plVar2[1] * iVar6;
            get_remote_block_pos(lVar21,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
            lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
            if (lVar11 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
              sVar15 = strlen(err_string);
              iVar24 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar28 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rcv[lVar28],shi_rcv[lVar28]);
                  sVar15 = strlen(err_string);
                  iVar24 = (int)sVar15;
                  lVar28 = lVar28 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar28 < IVar16);
              }
              (err_string + iVar24)[0] = ']';
              (err_string + iVar24)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            dVar8 = *proclist;
            *(double *)((long)plVar2 + ndim * 4 + 0x18) = dVar8;
            if (-1 < iVar7) {
              *(long *)((long)plVar2 + ndim * 4 + 0x18) =
                   (long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
            }
            piVar17 = (int *)((long)plVar2 + ndim * 4 + 0x28);
            piVar19 = (int *)((long)puVar18 + (ndim + 8) * 4);
            plVar3 = (long *)(piVar19 + ndim);
            pdVar31 = (double *)((long)plVar3 + ndim * 4 + 8);
            lVar28 = 0;
            do {
              if (lVar21 == lVar28) {
                lVar14 = lo_loc[lVar21] - width[lVar21];
                lVar23 = lo_loc[lVar21] + -1;
              }
              else {
                lVar14 = lo_loc[lVar28];
                lVar23 = hi_loc[lVar28];
              }
              lo_rcv[lVar28] = lVar14;
              hi_rcv[lVar28] = lVar23;
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            lVar28 = 0;
            do {
              if (lVar21 == lVar28) {
                if (hi_rcv[lVar21] < 1) {
                  shi_rcv[lVar21] = dims[lVar21];
                  slo_rcv[lVar21] = (dims[lVar21] - width[lVar21]) + 1;
                }
                else {
                  slo_rcv[lVar21] = lo_rcv[lVar21];
                  shi_rcv[lVar21] = hi_rcv[lVar21];
                }
              }
              else {
                slo_rcv[lVar28] = lo_rcv[lVar28];
                shi_rcv[lVar28] = hi_rcv[lVar28];
              }
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            lVar11 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
            if (lVar11 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
              sVar15 = strlen(err_string);
              iVar24 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar28 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rcv[lVar28],shi_rcv[lVar28]);
                  sVar15 = strlen(err_string);
                  iVar24 = (int)sVar15;
                  lVar28 = lVar28 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar28 < IVar16);
              }
              (err_string + iVar24)[0] = ']';
              (err_string + iVar24)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            dVar8 = *proclist;
            *(double *)((long)plVar2 + ndim * 4 + 0x20) = dVar8;
            if (-1 < iVar7) {
              *(long *)((long)plVar2 + ndim * 4 + 0x20) =
                   (long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
            }
            pgVar10 = GA;
            lVar28 = 0;
            do {
              if (increment[lVar28] == 0) {
                if (lVar21 == lVar28) {
                  plo_snd[lVar21] = (hi_loc[lVar21] - lo_loc[lVar21]) + 1;
                  phi_snd[lVar21] = (hi_loc[lVar21] - lo_loc[lVar21]) + width[lVar21];
                  plo_rcv[lVar21] = 0;
                  phi_rcv[lVar21] = width[lVar21] + -1;
                }
                else {
                  lVar14 = width[lVar28];
                  plo_snd[lVar28] = lVar14;
                  lVar23 = (hi_loc[lVar28] - lo_loc[lVar28]) + lVar14;
                  phi_snd[lVar28] = lVar23;
                  plo_rcv[lVar28] = lVar14;
                  phi_rcv[lVar28] = lVar23;
                }
              }
              else {
                plo_rcv[lVar28] = 0;
                lVar14 = (hi_loc[lVar28] - lo_loc[lVar28]) + increment[lVar28];
                phi_rcv[lVar28] = lVar14;
                plo_snd[lVar28] = 0;
                phi_snd[lVar28] = lVar14;
              }
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            uVar5 = GA[lVar1].ndim;
            uVar30 = (ulong)(short)uVar5;
            iVar24 = GA[lVar1].distr_type;
            if (iVar24 - 1U < 3) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                lVar28 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar28);
                  lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + lVar28 * 2);
                  *(long *)(err_string + lVar28 * 2) = lVar14 * iVar24 + 1;
                  lVar14 = ((long)iVar24 + 1) * lVar14;
                  lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar28 * 2);
                  if (lVar23 <= lVar14) {
                    lVar14 = lVar23;
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 4) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar1].mapc;
                lVar28 = 0;
                iVar24 = 0;
                do {
                  iVar20 = *(int *)((long)_index + lVar28);
                  lVar23 = (long)iVar24 + (long)iVar20;
                  *(C_Integer *)(err_string + lVar28 * 2) = pCVar9[lVar23];
                  lVar14 = *(long *)((long)GA[lVar1].num_blocks + lVar28 * 2);
                  if ((long)iVar20 < lVar14 + -1) {
                    lVar23 = pCVar9[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar28 * 2);
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar23;
                  iVar24 = iVar24 + (int)lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) {
LAB_0017ee24:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar30 * 8;
                      goto LAB_0017ee32;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) goto LAB_0017ee24;
                  if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar5) {
                sVar15 = (ulong)uVar5 << 3;
LAB_0017ee32:
                memset(err_string,0,sVar15);
                memset(_hi,0xff,sVar15);
              }
            }
            if (uVar30 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar28 = 1;
              lVar14 = 0;
            }
            else {
              lVar28 = 1;
              lVar14 = 0;
              lVar23 = 0;
              do {
                lVar14 = lVar14 + plo_snd[lVar23] * lVar28;
                lVar29 = (_hi[lVar23] - hi_loc[lVar23 + -0x20]) +
                         pgVar10[g_a + 1000].width[lVar23] * 2 + 1;
                ld_loc[lVar23] = lVar29;
                lVar28 = lVar28 * lVar29;
                lVar23 = lVar23 + 1;
              } while (uVar30 - 1 != lVar23);
            }
            *puVar18 = pgVar10[lVar1].ptr[proc] +
                       (long)pgVar10[lVar1].elemsize * (lVar28 * plo_snd[uVar30 - 1] + lVar14);
            pgVar10 = GA;
            uVar5 = GA[lVar1].ndim;
            uVar30 = (ulong)(short)uVar5;
            iVar24 = GA[lVar1].distr_type;
            if (iVar24 - 1U < 3) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                lVar28 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar28);
                  lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + lVar28 * 2);
                  *(long *)(err_string + lVar28 * 2) = lVar14 * iVar24 + 1;
                  lVar14 = ((long)iVar24 + 1) * lVar14;
                  lVar23 = *(long *)((long)GA[g_a + 1000].dims + lVar28 * 2);
                  if (lVar23 <= lVar14) {
                    lVar14 = lVar23;
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 4) {
              lVar28 = GA[lVar1].num_blocks[0];
              lVar14 = lVar22 % lVar28;
              _index[0] = (int)lVar14;
              if (1 < (short)uVar5) {
                lVar23 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar14) / lVar28;
                  lVar28 = GA[g_a + 1000].num_blocks[lVar23 + 1];
                  lVar14 = (long)(int)IVar16 % lVar28;
                  _index[lVar23 + 1] = (int)lVar14;
                  lVar23 = lVar23 + 1;
                } while ((uVar30 & 0xffffffff) - 1 != lVar23);
              }
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar1].mapc;
                lVar28 = 0;
                iVar24 = 0;
                do {
                  iVar20 = *(int *)((long)_index + lVar28);
                  lVar23 = (long)iVar24 + (long)iVar20;
                  *(C_Integer *)(err_string + lVar28 * 2) = pCVar9[lVar23];
                  lVar14 = *(long *)((long)GA[lVar1].num_blocks + lVar28 * 2);
                  if ((long)iVar20 < lVar14 + -1) {
                    lVar23 = pCVar9[lVar23 + 1] + -1;
                  }
                  else {
                    lVar23 = *(long *)((long)GA[lVar1].dims + lVar28 * 2);
                  }
                  *(long *)((long)_hi + lVar28 * 2) = lVar23;
                  iVar24 = iVar24 + (int)lVar14;
                  lVar28 = lVar28 + 4;
                } while ((uVar30 & 0xffffffff) << 2 != lVar28);
              }
            }
            else if (iVar24 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) {
LAB_0017f289:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar30 * 8;
                      goto LAB_0017f297;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar28 = 1;
                  uVar25 = 0;
                  do {
                    lVar28 = lVar28 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar30 != uVar25);
                  if ((proc < 0) || (lVar28 <= proc)) goto LAB_0017f289;
                  if (0 < (short)uVar5) {
                    pCVar9 = GA[lVar1].mapc;
                    lVar28 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar23 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar14 = IVar16 % lVar23;
                      hi_loc[uVar25 - 0x20] = pCVar9[lVar14 + lVar28];
                      if (lVar14 == lVar23 + -1) {
                        CVar26 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar26 = pCVar9[lVar14 + lVar28 + 1] + -1;
                      }
                      lVar28 = lVar28 + lVar23;
                      _hi[uVar25] = CVar26;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar23;
                    } while (uVar30 != uVar25);
                  }
                }
              }
              else if (0 < (short)uVar5) {
                sVar15 = (ulong)uVar5 << 3;
LAB_0017f297:
                memset(err_string,0,sVar15);
                memset(_hi,0xff,sVar15);
              }
            }
            if (uVar30 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar28 = 1;
              lVar14 = 0;
            }
            else {
              lVar28 = 1;
              lVar14 = 0;
              lVar23 = 0;
              do {
                lVar14 = lVar14 + plo_rcv[lVar23] * lVar28;
                lVar29 = (_hi[lVar23] - hi_loc[lVar23 + -0x20]) +
                         pgVar10[g_a + 1000].width[lVar23] * 2 + 1;
                ld_loc[lVar23] = lVar29;
                lVar28 = lVar28 * lVar29;
                lVar23 = lVar23 + 1;
              } while (uVar30 - 1 != lVar23);
            }
            *(char **)((long)plVar2 + ndim * 4 + 0x10) =
                 pgVar10[lVar1].ptr[proc] +
                 (long)pgVar10[lVar1].elemsize * (lVar28 * plo_rcv[uVar30 - 1] + lVar14);
            *(int *)((long)plVar2 + ndim * 4 + 0x28) = iVar6;
            *piVar19 = iVar6;
            if (sVar4 != 1) {
              iVar24 = *piVar17;
              lVar28 = 0;
              iVar20 = iVar6;
              do {
                IVar16 = ld_loc[lVar28];
                iVar20 = iVar20 * (int)IVar16;
                *(int *)((long)pdVar12 + lVar28 * 4 + ndim * 0x10 + 0x48) = iVar20;
                piVar17[lVar28] = iVar24 * (int)IVar16;
                *(int *)((long)pdVar12 + lVar28 * 4 + ndim * 0x10 + 0x4c) = iVar20;
                iVar24 = piVar17[lVar28];
                *(int *)((long)plVar2 + lVar28 * 4 + ndim * 4 + 0x2c) = iVar24;
                lVar28 = lVar28 + 1;
              } while (local_4f0 != lVar28);
            }
            lVar28 = 0;
            do {
              *(int *)((long)plVar3 + lVar28 * 4 + 8) =
                   ((int)phi_rcv[lVar28] - (int)plo_rcv[lVar28]) + 1;
              lVar28 = lVar28 + 1;
            } while (ndim != lVar28);
            *plVar3 = 1;
            lVar28 = 1;
            lVar14 = 0;
            do {
              lVar28 = lVar28 * ((phi_snd[lVar14] - plo_snd[lVar14]) + 1);
              *plVar3 = lVar28;
              lVar14 = lVar14 + 1;
            } while (ndim != lVar14);
            *plVar3 = lVar28 * (long)dVar13;
            *(int *)(plVar3 + 1) = (int)plVar3[1] * iVar6;
          }
          if (GA[lVar1].corner_flag != 0) {
            increment[lVar21] = width[lVar21] * 2;
          }
          lVar21 = lVar21 + 1;
          pdVar12 = pdVar31;
        } while (lVar21 != ndim);
      }
      goto LAB_0017f4ad;
    }
  }
  *pdVar12 = dVar13;
LAB_0017f4ad:
  free(map);
  free(proclist);
  return 1;
}

Assistant:

logical pnga_set_update4_info(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, *bufsize, ndim, increment[MAXDIM];
  Integer *proc_rem_snd, *proc_rem_rcv;
  Integer *length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int *stride_snd, *stride_rcv, *count, cache_size;
  /*int corner_flag;*/
  char **ptr_snd, **ptr_rcv, *cache;
  char *current;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets the arrays that are used to transfer data using
   * the update4. To perform the update, this routine makes use of several
   * copies of indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  cache_size = 2*sizeof(char *)+3*ndim*sizeof(int)+3*sizeof(Integer);
  cache_size = 2* ndim *((cache_size/8) + 1) + 1;
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  /*corner_flag = GA[handle].corner_flag;*/
#if GHOST_PRINT
      printf("p[%d]a cache_size: %d\n",GAme,cache_size);
#endif

  /* initialize range increments and get array dimensions */

  pnga_distribution(g_a,me,lo_loc,hi_loc);
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) {
      *(char**)cache = NULL;
      return FALSE;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = (Integer*)cache;
#if GHOST_PRINT
      printf("p[%d]a initial pointer: %d\n",GAme,(Integer)bufsize);
      fflush(stdout);
#endif
  current = (char*)(bufsize+1);

  *bufsize = size*buflen;
#if GHOST_PRINT
      printf("p[%d]a buflen: %d size: %d bufsize: %d\n",GAme,buflen,size,*bufsize);
      fflush(stdout);
#endif

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;

#if GHOST_PRINT
      printf("p[%d]a 1: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;
#if GHOST_PRINT
      printf("p[%d]a 2: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }
#if GHOST_PRINT
      printf("p[%d]a final pointer: %d\n",GAme,(Integer)(Integer*)current);
      fflush(stdout);
#endif
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}